

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O3

string * __thiscall
deqp::gles31::Functional::textureTypeExtensionShaderRequires_abi_cxx11_
          (string *__return_storage_ptr__,Functional *this,TextureType type,
          RenderContext *renderContext)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  ContextType ctxType;
  long *plVar4;
  string *extraout_RAX;
  string *psVar5;
  string *extraout_RAX_00;
  string *extraout_RAX_01;
  long *plVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  undefined4 in_register_00000014;
  long *local_60;
  long local_58;
  long local_50;
  long lStack_48;
  long *local_40 [2];
  long local_30 [2];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(**(code **)(*(long *)CONCAT44(in_register_00000014,type) + 0x10))
                          ((long *)CONCAT44(in_register_00000014,type));
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (((int)this == 7) && (!bVar3)) {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"GL_EXT_texture_buffer","");
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_40,0,(char *)0x0,0x9cc7d5);
    plVar6 = plVar4 + 2;
    if ((long *)*plVar4 == plVar6) {
      local_50 = *plVar6;
      lStack_48 = plVar4[3];
      local_60 = &local_50;
    }
    else {
      local_50 = *plVar6;
      local_60 = (long *)*plVar4;
    }
    local_58 = plVar4[1];
    *plVar4 = (long)plVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    psVar5 = (string *)std::__cxx11::string::append((char *)&local_60);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (psVar5->_M_dataplus)._M_p;
    paVar7 = &psVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar7) {
      uVar2 = *(undefined8 *)((long)&psVar5->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar7->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = psVar5->_M_string_length;
    (psVar5->_M_dataplus)._M_p = (pointer)paVar7;
    psVar5->_M_string_length = 0;
    (psVar5->field_2)._M_local_buf[0] = '\0';
    if (local_60 != &local_50) {
      operator_delete(local_60,local_50 + 1);
      psVar5 = extraout_RAX_00;
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
      psVar5 = extraout_RAX_01;
    }
    return psVar5;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,0x96985f);
  return extraout_RAX;
}

Assistant:

static inline string textureTypeExtensionShaderRequires (TextureType type, const RenderContext& renderContext)
{
	if (!glu::contextSupports(renderContext.getType(), glu::ApiType::es(3, 2)) && (type == TEXTURETYPE_BUFFER))
		return "#extension " + string(s_texBufExtString) + " : require\n";
	else
		return "";
}